

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O2

void __thiscall Node::printOutcomingEdges(Node *this,ostream *ostream)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  string local_70;
  string local_50;
  
  for (p_Var2 = (this->successors_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->successors_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    dotName_abi_cxx11_(&local_50,this);
    poVar1 = std::operator<<(ostream,(string *)&local_50);
    poVar1 = std::operator<<(poVar1," -> ");
    dotName_abi_cxx11_(&local_70,*(Node **)(p_Var2 + 1));
    poVar1 = std::operator<<(poVar1,(string *)&local_70);
    std::operator<<(poVar1,"\n");
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
  }
  return;
}

Assistant:

void Node::printOutcomingEdges(ostream &ostream) const {
    for (const auto &successor : successors_) {
        ostream << this->dotName() << " -> " << successor->dotName() << "\n";
    }
}